

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerTargeter::EndEffect(APowerTargeter *this)

{
  AActor *pAVar1;
  DPSprite *pDVar2;
  TObjPtr<AActor> *obj;
  
  APowerup::EndEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar1 != (AActor *)0x0) {
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar1->player != (player_t *)0x0) {
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
      pDVar2 = player_t::FindPSprite(pAVar1->player,0x7ffffffd);
      if (pDVar2 != (DPSprite *)0x0) {
        DPSprite::SetState(pDVar2,(FState *)0x0,false);
      }
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
      pDVar2 = player_t::FindPSprite(pAVar1->player,0x7ffffffe);
      if (pDVar2 != (DPSprite *)0x0) {
        DPSprite::SetState(pDVar2,(FState *)0x0,false);
      }
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)obj);
      pDVar2 = player_t::FindPSprite(pAVar1->player,0x7fffffff);
      if (pDVar2 != (DPSprite *)0x0) {
        DPSprite::SetState(pDVar2,(FState *)0x0,false);
        return;
      }
    }
  }
  return;
}

Assistant:

void APowerTargeter::EndEffect ()
{
	Super::EndEffect();
	if (Owner != nullptr && Owner->player != nullptr)
	{
		// Calling GetPSprite here could crash if we're creating a new game.
		// This is because P_SetupLevel nulls the player's mo before destroying
		// every DThinker which in turn ends up calling this.
		// However P_SetupLevel is only called after G_NewInit which calls
		// every player's dtor which destroys all their psprites.
		DPSprite *pspr;
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETCENTER)) != nullptr) pspr->SetState(nullptr);
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETLEFT)) != nullptr) pspr->SetState(nullptr);
		if ((pspr = Owner->player->FindPSprite(PSP_TARGETRIGHT)) != nullptr) pspr->SetState(nullptr);
	}
}